

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

shared_ptr<kratos::Var> __thiscall
kratos::Generator::get_auxiliary_var(Generator *this,uint32_t width,bool signed_)

{
  bool bVar1;
  mapped_type *pmVar2;
  byte in_CL;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined4 in_register_00000034;
  long lVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_false,_false>,_bool>
  pVar5;
  shared_ptr<kratos::Var> sVar6;
  bool local_44 [4];
  long local_40;
  undefined1 local_31;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_false> local_28;
  byte local_1d;
  key_type local_1c;
  bool signed__local;
  long lStack_18;
  uint32_t width_local;
  Generator *this_local;
  shared_ptr<kratos::Var> *v;
  
  lVar4 = CONCAT44(in_register_00000034,width);
  local_1c = (key_type)CONCAT71(in_register_00000011,signed_);
  local_1d = in_CL & 1;
  lStack_18 = lVar4;
  this_local = this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::shared_ptr<kratos::Var>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>_>
       ::find((unordered_map<unsigned_int,_std::shared_ptr<kratos::Var>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>_>
               *)(lVar4 + 0x450),&local_1c);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::shared_ptr<kratos::Var>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>_>
       ::end((unordered_map<unsigned_int,_std::shared_ptr<kratos::Var>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>_>
              *)(lVar4 + 0x450));
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    pmVar2 = std::
             unordered_map<unsigned_int,_std::shared_ptr<kratos::Var>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>_>
             ::at((unordered_map<unsigned_int,_std::shared_ptr<kratos::Var>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>_>
                   *)(lVar4 + 0x450),&local_1c);
    std::shared_ptr<kratos::Var>::shared_ptr((shared_ptr<kratos::Var> *)this,pmVar2);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    local_31 = 0;
    local_44[0] = true;
    local_44[1] = false;
    local_44[2] = false;
    local_44[3] = false;
    local_40 = lVar4;
    std::make_shared<kratos::Var,kratos::Generator*,char_const(&)[1],unsigned_int&,int,bool&>
              ((Generator **)this,(char (*) [1])&local_40,(uint *)0x433aa9,(int *)&local_1c,local_44
              );
    pVar5 = std::
            unordered_map<unsigned_int,std::shared_ptr<kratos::Var>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<kratos::Var>>>>
            ::emplace<unsigned_int&,std::shared_ptr<kratos::Var>&>
                      ((unordered_map<unsigned_int,std::shared_ptr<kratos::Var>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<kratos::Var>>>>
                        *)(lVar4 + 0x450),&local_1c,(shared_ptr<kratos::Var> *)this);
    _Var3._M_pi = pVar5._8_8_;
  }
  sVar6.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar6.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Var>)sVar6.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Var> Generator::get_auxiliary_var(uint32_t width, bool signed_) {
    if (auxiliary_vars_.find(width) != auxiliary_vars_.end()) {
        return auxiliary_vars_.at(width);
    }
    auto v = std::make_shared<Var>(this, "", width, 1, signed_);
    auxiliary_vars_.emplace(width, v);
    return v;
}